

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmi_helper.c
# Opt level: O0

uint64_t helper_punpckhbh_mips(uint64_t fs,uint64_t ft)

{
  undefined1 uStack_34;
  undefined1 uStack_33;
  undefined1 uStack_32;
  undefined1 uStack_31;
  LMIValue vt;
  LMIValue vs;
  LMIValue vd;
  uint host;
  uint64_t ft_local;
  uint64_t fs_local;
  
  vt.ub[4] = (uint8_t)(fs >> 0x20);
  vs.ub[0] = vt.ub[4];
  uStack_34 = (uint8_t)(ft >> 0x20);
  vs.ub[1] = uStack_34;
  vt.ub[5] = (uint8_t)(fs >> 0x28);
  vs.ub[2] = vt.ub[5];
  uStack_33 = (uint8_t)(ft >> 0x28);
  vs.ub[3] = uStack_33;
  vt.ub[6] = (uint8_t)(fs >> 0x30);
  vs.ub[4] = vt.ub[6];
  uStack_32 = (uint8_t)(ft >> 0x30);
  vs.ub[5] = uStack_32;
  vt.ub[7] = (uint8_t)(fs >> 0x38);
  vs.ub[6] = vt.ub[7];
  uStack_31 = (uint8_t)(ft >> 0x38);
  vs.ub[7] = uStack_31;
  return vs.d;
}

Assistant:

uint64_t helper_punpckhbh(uint64_t fs, uint64_t ft)
{
    unsigned host = BYTE_ORDER_XOR(7);
    LMIValue vd, vs, vt;

    vs.d = fs;
    vt.d = ft;
    vd.ub[0 ^ host] = vs.ub[4 ^ host];
    vd.ub[1 ^ host] = vt.ub[4 ^ host];
    vd.ub[2 ^ host] = vs.ub[5 ^ host];
    vd.ub[3 ^ host] = vt.ub[5 ^ host];
    vd.ub[4 ^ host] = vs.ub[6 ^ host];
    vd.ub[5 ^ host] = vt.ub[6 ^ host];
    vd.ub[6 ^ host] = vs.ub[7 ^ host];
    vd.ub[7 ^ host] = vt.ub[7 ^ host];

    return vd.d;
}